

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sprint_lu_col(char *msg,int jcol,int pivrow,int_t *xprune,GlobalLU_t *Glu)

{
  int *piVar1;
  int *piVar2;
  int_t *piVar3;
  int_t *piVar4;
  void *pvVar5;
  int_t *piVar6;
  void *pvVar7;
  int_t *piVar8;
  int_t *piVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  piVar1 = Glu->xsup;
  piVar2 = Glu->supno;
  piVar3 = Glu->lsub;
  piVar4 = Glu->xlsub;
  pvVar5 = Glu->lusup;
  piVar6 = Glu->xlusup;
  pvVar7 = Glu->ucol;
  piVar8 = Glu->usub;
  piVar9 = Glu->xusub;
  printf("%s",msg);
  lVar12 = (long)jcol;
  printf("col %d: pivrow %d, supno %d, xprune %lld\n",jcol,pivrow,(ulong)(uint)piVar2[lVar12],
         (long)xprune[lVar12]);
  puts("\tU-col:");
  lVar10 = (long)piVar9[lVar12];
  if (piVar9[lVar12] < piVar9[lVar12 + 1]) {
    do {
      printf("\t%d%10.4f\n",(double)*(float *)((long)pvVar7 + lVar10 * 4),
             (ulong)(uint)piVar8[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < piVar9[lVar12 + 1]);
  }
  puts("\tL-col in rectangular snode:");
  lVar13 = (long)piVar1[piVar2[lVar12]];
  lVar10 = (long)piVar4[lVar13];
  if (piVar4[lVar13] < piVar4[lVar13 + 1]) {
    lVar11 = (long)piVar6[lVar12];
    do {
      if (piVar6[lVar12 + 1] <= lVar11) break;
      printf("\t%d\t%10.4f\n",(double)*(float *)((long)pvVar5 + lVar11 * 4),
             (ulong)(uint)piVar3[lVar10]);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar10 < piVar4[lVar13 + 1]);
  }
  fflush(_stdout);
  return;
}

Assistant:

void
sprint_lu_col(char *msg, int jcol, int pivrow, int_t *xprune, GlobalLU_t *Glu)
{
    int_t    i, k;
    int     *xsup, *supno, fsupc;
    int_t   *xlsub, *lsub;
    float  *lusup;
    int_t   *xlusup;
    float  *ucol;
    int_t   *usub, *xusub;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (float *) Glu->lusup;
    xlusup  = Glu->xlusup;
    ucol    = (float *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    
    printf("%s", msg);
    printf("col %d: pivrow %d, supno %d, xprune %lld\n", 
	   jcol, pivrow, supno[jcol], (long long) xprune[jcol]);
    
    printf("\tU-col:\n");
    for (i = xusub[jcol]; i < xusub[jcol+1]; i++)
	printf("\t%d%10.4f\n", (int)usub[i], ucol[i]);
    printf("\tL-col in rectangular snode:\n");
    fsupc = xsup[supno[jcol]];	/* first col of the snode */
    i = xlsub[fsupc];
    k = xlusup[jcol];
    while ( i < xlsub[fsupc+1] && k < xlusup[jcol+1] ) {
	printf("\t%d\t%10.4f\n", (int)lsub[i], lusup[k]);
	i++; k++;
    }
    fflush(stdout);
}